

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O3

bool qHashEquals<SubArray>(SubArray *a,SubArray *b)

{
  size_t __n;
  int iVar1;
  
  __n = a->len;
  if (__n != b->len) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((a->array).d.ptr + a->from,(b->array).d.ptr + b->from,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

inline bool operator==(const SubArray &other) const {
        if (len != other.len)
            return false;
        const auto begin = array.cbegin() + from;
        const auto end = begin + len;
        const auto other_begin = other.array.cbegin() + other.from;
        return std::equal(begin, end, other_begin);
    }